

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O0

EmbedLabelNode * __thiscall
asmjit::v1_14::ZoneAllocator::
newT<asmjit::v1_14::EmbedLabelNode,asmjit::v1_14::BaseBuilder*,unsigned_int,unsigned_int>
          (ZoneAllocator *this,BaseBuilder **args,uint *args_1,uint *args_2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  EmbedLabelNode *pEVar4;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  long *in_RSI;
  void *p;
  size_t in_stack_ffffffffffffff58;
  ZoneAllocator *in_stack_ffffffffffffff60;
  EmbedLabelNode *local_98;
  EmbedLabelNode *local_50;
  
  pEVar4 = allocT<asmjit::v1_14::EmbedLabelNode>
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (pEVar4 == (EmbedLabelNode *)0x0) {
    local_50 = (EmbedLabelNode *)0x0;
  }
  else {
    local_98 = (EmbedLabelNode *)0x0;
    if (pEVar4 != (EmbedLabelNode *)0x0) {
      lVar3 = *in_RSI;
      uVar1 = *in_RDX;
      uVar2 = *in_RCX;
      *(undefined8 *)pEVar4 = 0;
      *(undefined8 *)(pEVar4 + 8) = 0;
      pEVar4[0x10] = (EmbedLabelNode)0x6;
      pEVar4[0x11] = (EmbedLabelNode)(*(byte *)(lVar3 + 0x1b0) | 2);
      pEVar4[0x12] = (EmbedLabelNode)0x0;
      pEVar4[0x13] = (EmbedLabelNode)0x0;
      *(undefined4 *)(pEVar4 + 0x14) = 0;
      *(undefined8 *)(pEVar4 + 0x18) = 0;
      *(undefined8 *)(pEVar4 + 0x20) = 0;
      *(undefined8 *)(pEVar4 + 0x28) = 0;
      *(undefined4 *)(pEVar4 + 0x30) = uVar1;
      *(undefined4 *)(pEVar4 + 0x34) = uVar2;
      local_98 = pEVar4;
    }
    local_50 = local_98;
  }
  return local_50;
}

Assistant:

inline T* newT(Args&&... args) noexcept {
    void* p = allocT<T>();
    if (ASMJIT_UNLIKELY(!p))
      return nullptr;
    return new(Support::PlacementNew{p}) T(std::forward<Args>(args)...);
  }